

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::AddSub
          (TPZMatrix<std::complex<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<double>_> *pA)

{
  TPZBaseMatrix *pTVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  TPZBaseMatrix *in_stack_00000010;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  int64_t NewColSize;
  int64_t NewRowSize;
  char *in_stack_00000138;
  char *in_stack_00000140;
  complex<double> *in_stack_ffffffffffffff38;
  undefined1 local_70 [16];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_stack_00000010);
  if (in_R9 + in_RCX <= iVar3) {
    lVar4 = in_stack_00000008 + local_28;
    iVar3 = TPZBaseMatrix::Cols(in_stack_00000010);
    if (lVar4 <= iVar3) goto LAB_012b4762;
  }
  Error(in_stack_00000140,in_stack_00000138);
LAB_012b4762:
  local_38 = local_20 + local_30;
  local_40 = local_28 + in_stack_00000008;
  local_48 = local_10;
  for (local_50 = local_30; local_50 < local_38; local_50 = local_50 + 1) {
    local_58 = local_18;
    for (local_60 = in_stack_00000008; lVar2 = local_50, lVar4 = local_60,
        pTVar1 = in_stack_00000010, local_60 < local_40; local_60 = local_60 + 1) {
      (**(code **)(*in_RDI + 0x120))(in_RDI,local_48,local_58);
      (*(in_stack_00000010->super_TPZSavable)._vptr_TPZSavable[0x24])
                (in_stack_00000010,local_50,local_60);
      std::operator+(in_stack_ffffffffffffff38,(complex<double> *)0x12b486d);
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar2,lVar4,local_70);
      local_58 = local_58 + 1;
    }
    local_48 = local_48 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}